

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O0

void __thiscall Ptex::v2_2::PtexReader::readFaceInfo(PtexReader *this)

{
  bool bVar1;
  reference data;
  reference faceids;
  PtexReader *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> faceids_r;
  int nfaces;
  FilePos in_stack_ffffffffffffff78;
  PtexReader *in_stack_ffffffffffffff80;
  size_type __n;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint32_t uVar2;
  size_type in_stack_ffffffffffffff98;
  vector<Ptex::v2_2::FaceInfo,_std::allocator<Ptex::v2_2::FaceInfo>_> *this_00;
  int nfaces_00;
  FaceInfo *faces;
  undefined1 local_29 [29];
  uint32_t local_c;
  
  bVar1 = std::vector<Ptex::v2_2::FaceInfo,_std::allocator<Ptex::v2_2::FaceInfo>_>::empty
                    ((vector<Ptex::v2_2::FaceInfo,_std::allocator<Ptex::v2_2::FaceInfo>_> *)
                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  if (bVar1) {
    seek(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    local_c = (in_RDI->_header).nfaces;
    this_00 = &in_RDI->_faceinfo;
    std::vector<Ptex::v2_2::FaceInfo,_std::allocator<Ptex::v2_2::FaceInfo>_>::resize
              (this_00,in_stack_ffffffffffffff98);
    data = std::vector<Ptex::v2_2::FaceInfo,_std::allocator<Ptex::v2_2::FaceInfo>_>::operator[]
                     (this_00,0);
    readZipBlock(in_RDI,data,(in_RDI->_header).faceinfosize,local_c * 0x14);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
               in_stack_ffffffffffffff98);
    nfaces_00 = (int)local_c >> 0x1f;
    faces = (FaceInfo *)local_29;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x135e63);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
               in_stack_ffffffffffffff98,
               (allocator_type *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x135e83);
    __n = 0;
    std::vector<Ptex::v2_2::FaceInfo,_std::allocator<Ptex::v2_2::FaceInfo>_>::operator[]
              (&in_RDI->_faceinfo,0);
    uVar2 = local_c;
    faceids = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (&in_RDI->_rfaceids,__n);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_29 + 1),__n);
    PtexUtils::genRfaceids(faces,nfaces_00,(uint32_t *)this_00,faceids);
    increaseMemUsed(in_RDI,(long)(int)local_c * 0x18);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(uVar2,in_stack_ffffffffffffff90));
  }
  return;
}

Assistant:

void PtexReader::readFaceInfo()
{
    if (_faceinfo.empty()) {
        // read compressed face info block
        seek(_faceinfopos);
        int nfaces = _header.nfaces;
        _faceinfo.resize(nfaces);
        readZipBlock(&_faceinfo[0], _header.faceinfosize,
                     (int)(sizeof(FaceInfo)*nfaces));

        // generate rfaceids
        _rfaceids.resize(nfaces);
        std::vector<uint32_t> faceids_r(nfaces);
        PtexUtils::genRfaceids(&_faceinfo[0], nfaces,
                               &_rfaceids[0], &faceids_r[0]);
        increaseMemUsed(nfaces * (sizeof(_faceinfo[0]) + sizeof(_rfaceids[0])));
    }
}